

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int vs_vlc(bitstream *str,uint32_t *val,vs_vlc_val *tab)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  uint32_t *val_00;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint32_t bit [32];
  uint32_t local_b8 [34];
  
  if (str->dir == VS_ENCODE) {
    iVar2 = tab->blen;
    if (iVar2 != 0) {
      uVar1 = tab->val;
      while( true ) {
        if (*val == uVar1) {
          if (0 < iVar2) {
            lVar8 = 0;
            do {
              local_b8[0] = tab->bits[lVar8];
              iVar2 = vs_u(str,local_b8,1);
              if (iVar2 != 0) {
                return 1;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < tab->blen);
          }
          return 0;
        }
        iVar2 = tab[1].blen;
        if (iVar2 == 0) break;
        uVar1 = tab[1].val;
        tab = tab + 1;
      }
    }
    vs_vlc_cold_2();
  }
  else {
    iVar2 = tab->blen;
    if (iVar2 != 0) {
      piVar4 = &tab->blen;
      piVar5 = tab->bits;
      uVar3 = 0;
      lVar8 = 0;
      do {
        if (iVar2 < 1) {
          iVar6 = 0;
        }
        else {
          val_00 = local_b8;
          uVar7 = 0;
          do {
            if (uVar7 == uVar3) {
              iVar2 = vs_u(str,val_00,1);
              if (iVar2 != 0) {
                return 1;
              }
              uVar3 = (int)uVar7 + 1;
              iVar2 = *piVar4;
            }
            if (*val_00 != piVar5[uVar7]) break;
            uVar7 = uVar7 + 1;
            val_00 = val_00 + 1;
          } while ((long)uVar7 < (long)iVar2);
          iVar6 = (int)uVar7;
        }
        if (iVar6 == iVar2) {
          *val = tab[lVar8].val;
          return 0;
        }
        piVar4 = &tab[lVar8 + 1].blen;
        iVar2 = *piVar4;
        piVar5 = piVar5 + 0x22;
        lVar8 = lVar8 + 1;
      } while (iVar2 != 0);
    }
    vs_vlc_cold_1();
  }
  return 1;
}

Assistant:

int vs_vlc(struct bitstream *str, uint32_t *val, const struct vs_vlc_val *tab) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (*val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j];
					if (vs_u(str, &bit, 1))
						return 1;
				}
				return 0;
			}
		}
		fprintf(stderr, "No VLC code for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[32];
		int n = 0;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (j == n) {
					if (vs_u(str, &bit[j], 1)) return 1;
					n = j + 1;
				}
				if (bit[j] != tab[i].bits[j])
					break;
			}
			if (j == tab[i].blen) {
				*val = tab[i].val;
				return 0;
			}
		}
		fprintf(stderr, "Invalid VLC code\n");
		return 1;
	}
}